

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::BufferedMessageStream::readEntireMessage
          (BufferedMessageStream *this,ArrayPtr<const_unsigned_char> prefix,
          size_t expectedSizeInWords,ArrayPtr<kj::OwnFd> fdSpace,size_t fdsSoFar,
          ReaderOptions options)

{
  ReaderOptions RVar1;
  bool bVar2;
  uchar *puVar3;
  uchar *__src;
  size_t sVar4;
  size_t sVar5;
  OwnFd *pOVar6;
  Array<capnp::word> *other;
  uchar *buffer;
  ArrayPtr<unsigned_char> AVar7;
  uchar *local_128;
  Array<capnp::word> local_120;
  size_t local_108;
  uint64_t uStack_100;
  bool local_f8;
  undefined7 uStack_f7;
  undefined8 local_f0;
  size_t local_e0;
  ArrayPtr<unsigned_char> local_d8;
  undefined1 local_c8 [8];
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  size_t bytesRemaining;
  word *local_a0;
  undefined1 local_98 [8];
  Array<capnp::word> msgBuffer;
  Fault local_70;
  Fault f;
  undefined1 local_60 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  size_t fdsSoFar_local;
  size_t expectedSizeInWords_local;
  BufferedMessageStream *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  _kjCondition._32_8_ = fdSpace.size_;
  fdsSoFar_local = (size_t)fdSpace.ptr;
  this_local = (BufferedMessageStream *)prefix.size_;
  buffer = prefix.ptr;
  expectedSizeInWords_local = (size_t)buffer;
  prefix_local.ptr = (uchar *)expectedSizeInWords;
  prefix_local.size_ = (size_t)this;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&fdsSoFar_local);
  kj::_::DebugExpression<unsigned_long&>::operator<=
            ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_60,
             (DebugExpression<unsigned_long&> *)&f,(unsigned_long *)&options.nestingLimit);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[40]>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++"
               ,0x319,FAILED,"expectedSizeInWords <= options.traversalLimitInWords",
               "_kjCondition,\"incoming RPC message exceeds size limit\"",
               (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_60,
               (char (*) [40])"incoming RPC message exceeds size limit");
    kj::_::Debug::Fault::fatal(&local_70);
  }
  kj::heapArray<capnp::word>((Array<capnp::word> *)local_98,fdsSoFar_local);
  AVar7 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_98);
  local_a0 = (word *)AVar7.size_;
  bytesRemaining = (size_t)AVar7.ptr;
  puVar3 = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&bytesRemaining);
  __src = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  sVar4 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  memcpy(puVar3,__src,sVar4);
  AVar7 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_98);
  promise.super_PromiseBase.node.ptr = (PromiseBase)AVar7.ptr;
  sVar5 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&promise);
  sVar4 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  sVar5 = sVar5 - sVar4;
  local_d8 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_98);
  puVar3 = kj::ArrayPtr<unsigned_char>::begin(&local_d8);
  sVar4 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  pOVar6 = kj::ArrayPtr<kj::OwnFd>::begin((ArrayPtr<kj::OwnFd> *)&fdsSoFar);
  pOVar6 = pOVar6 + _kjCondition._32_8_;
  kj::ArrayPtr<kj::OwnFd>::size((ArrayPtr<kj::OwnFd> *)&fdsSoFar);
  tryReadWithFds((BufferedMessageStream *)local_c8,buffer,(size_t)(puVar3 + sVar4),sVar5,
                 (OwnFd *)sVar5,(size_t)pOVar6);
  local_128 = buffer;
  other = kj::mv<kj::Array<capnp::word>>((Array<capnp::word> *)local_98);
  kj::Array<capnp::word>::Array(&local_120,other);
  RVar1 = options;
  local_108 = fdsSoFar;
  uStack_100 = options.traversalLimitInWords;
  local_f8 = _kjCondition.result;
  uStack_f7 = _kjCondition._33_7_;
  local_f0._0_4_ = options.nestingLimit;
  local_f0._4_4_ = options._12_4_;
  options = RVar1;
  local_e0 = sVar5;
  kj::Promise<kj::AsyncCapabilityStream::ReadResult>::
  then<capnp::BufferedMessageStream::readEntireMessage(kj::ArrayPtr<unsigned_char_const>,unsigned_long,kj::ArrayPtr<kj::OwnFd>,unsigned_long,capnp::ReaderOptions)::__0>
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,(Type *)local_c8);
  readEntireMessage(kj::ArrayPtr<unsigned_char_const>,unsigned_long,kj::ArrayPtr<kj::OwnFd>,unsigned_long,capnp::ReaderOptions)
  ::$_0::~__0((__0 *)&local_128);
  kj::Promise<kj::AsyncCapabilityStream::ReadResult>::~Promise
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)local_c8);
  kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_98);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> BufferedMessageStream::readEntireMessage(
    kj::ArrayPtr<const byte> prefix, size_t expectedSizeInWords,
    kj::ArrayPtr<kj::OwnFd> fdSpace, size_t fdsSoFar,
    ReaderOptions options) {
  KJ_REQUIRE(expectedSizeInWords <= options.traversalLimitInWords,
      "incoming RPC message exceeds size limit");

  auto msgBuffer = kj::heapArray<word>(expectedSizeInWords);

  memcpy(msgBuffer.asBytes().begin(), prefix.begin(), prefix.size());

  size_t bytesRemaining = msgBuffer.asBytes().size() - prefix.size();

  // TODO(perf): If we had scatter-read API support, we could optimistically try to read additional
  //   bytes into the shared buffer, to save syscalls when a big message is immediately followed
  //   by small messages.
  auto promise = tryReadWithFds(
      msgBuffer.asBytes().begin() + prefix.size(), bytesRemaining, bytesRemaining,
      fdSpace.begin() + fdsSoFar, fdSpace.size() - fdsSoFar);
  return promise
      .then([this, msgBuffer = kj::mv(msgBuffer), fdSpace, fdsSoFar, options, bytesRemaining]
            (kj::AsyncCapabilityStream::ReadResult result) mutable
            -> kj::Promise<kj::Maybe<MessageReaderAndFds>> {
    fdsSoFar += result.capCount;

    if (result.byteCount < bytesRemaining) {
      // Received EOF during message.
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "stream disconnected prematurely"));
      return kj::Maybe<MessageReaderAndFds>(kj::none);
    }

    size_t newExpectedSize = expectedSizeInWordsFromPrefix(msgBuffer);
    if (newExpectedSize > msgBuffer.size()) {
      // Unfortunately, the predicted size increased. This can happen if the segment table had
      // not been fully received when we generated the first prediction. This should be rare
      // (most segment tables are small and should be received all at once), but in this case we
      // will need to make a whole new copy of the message.
      //
      // We recurse here, but this should never recurse more than once, since we should always
      // have the entire segment table by this point and therefore the expected size is now final.
      //
      // TODO(perf): Technically it's guaranteed that the original expectation should have stopped
      //   at the boundary between two segments, so with a clever MesnsageReader implementation
      //   we could actually read the rest of the message into a second buffer, avoiding the copy.
      //   Unclear if it's worth the effort to implement this.
      return readEntireMessage(msgBuffer.asBytes(), newExpectedSize, fdSpace, fdsSoFar, options);
    }

    return kj::Maybe<MessageReaderAndFds>(MessageReaderAndFds {
      kj::heap<MessageReaderImpl>(kj::mv(msgBuffer), options),
      fdSpace.first(fdsSoFar)
    });
  });
}